

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O1

void ncnn::layernorm(float *ptr,float *gamma_ptr,float *beta_ptr,float eps,int elemcount,
                    int elempack)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  byte bVar32;
  byte bVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 auVar44 [32];
  uint uVar37;
  uint uVar38;
  undefined1 (*pauVar39) [64];
  int iVar40;
  ushort uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar45 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 in_register_00001204 [60];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  undefined1 auVar69 [64];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  
  auVar53._4_60_ = in_register_00001204;
  auVar53._0_4_ = eps;
  uVar34 = elempack * elemcount;
  pauVar39 = (undefined1 (*) [64])ptr;
  if ((int)uVar34 < 0x10) {
    auVar74 = ZEXT864(0);
    uVar37 = 0;
  }
  else {
    uVar37 = uVar34 & 0x7ffffff0;
    auVar74 = ZEXT864(0);
    iVar40 = 0xf;
    do {
      auVar74 = vaddps_avx512f(auVar74,*pauVar39);
      pauVar39 = pauVar39 + 1;
      iVar40 = iVar40 + 0x10;
    } while (iVar40 < (int)uVar34);
  }
  auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
  if ((int)(uVar37 | 7) < (int)uVar34) {
    auVar69 = ZEXT464(0) << 0x40;
    uVar38 = uVar37;
    do {
      auVar69 = ZEXT3264(CONCAT428(auVar69._28_4_ + *(float *)(*pauVar39 + 0x1c),
                                   CONCAT424(auVar69._24_4_ + *(float *)(*pauVar39 + 0x18),
                                             CONCAT420(auVar69._20_4_ + *(float *)(*pauVar39 + 0x14)
                                                       ,CONCAT416(auVar69._16_4_ +
                                                                  *(float *)(*pauVar39 + 0x10),
                                                                  CONCAT412(auVar69._12_4_ +
                                                                            *(float *)(*pauVar39 +
                                                                                      0xc),
                                                                            CONCAT48(auVar69._8_4_ +
                                                                                     *(float *)(*
                                                  pauVar39 + 8),
                                                  CONCAT44(auVar69._4_4_ + *(float *)(*pauVar39 + 4)
                                                           ,auVar69._0_4_ + *(float *)*pauVar39)))))
                                            )));
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
      uVar37 = uVar38 + 8;
      iVar40 = uVar38 + 0xf;
      uVar38 = uVar37;
    } while (iVar40 < (int)uVar34);
  }
  auVar42 = ZEXT816(0) << 0x40;
  if ((int)(uVar37 | 3) < (int)uVar34) {
    auVar61 = ZEXT464(0) << 0x40;
    uVar38 = uVar37;
    do {
      auVar42._0_4_ = auVar61._0_4_ + *(float *)*pauVar39;
      auVar42._4_4_ = auVar61._4_4_ + *(float *)(*pauVar39 + 4);
      auVar42._8_4_ = auVar61._8_4_ + *(float *)(*pauVar39 + 8);
      auVar42._12_4_ = auVar61._12_4_ + *(float *)(*pauVar39 + 0xc);
      auVar61 = ZEXT1664(auVar42);
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
      uVar37 = uVar38 + 4;
      iVar40 = uVar38 + 7;
      uVar38 = uVar37;
    } while (iVar40 < (int)uVar34);
  }
  auVar56 = ZEXT816(0) << 0x40;
  if ((int)uVar37 < (int)uVar34) {
    auVar47 = vpbroadcastq_avx512f();
    uVar36 = 0;
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar51 = auVar61;
      auVar61 = vpbroadcastq_avx512f();
      auVar50 = vporq_avx512f(auVar61,auVar48);
      auVar61 = vporq_avx512f(auVar61,auVar49);
      uVar20 = vpcmpuq_avx512f(auVar61,auVar47,2);
      bVar32 = (byte)uVar20;
      uVar20 = vpcmpuq_avx512f(auVar50,auVar47,2);
      bVar33 = (byte)uVar20;
      uVar41 = CONCAT11(bVar33,bVar32);
      piVar1 = (int *)(*pauVar39 + uVar36 * 4);
      auVar61._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * piVar1[1];
      auVar61._0_4_ = (uint)(bVar32 & 1) * *piVar1;
      auVar61._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * piVar1[2];
      auVar61._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * piVar1[3];
      auVar61._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * piVar1[4];
      auVar61._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * piVar1[5];
      auVar61._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * piVar1[6];
      auVar61._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * piVar1[7];
      auVar61._32_4_ = (uint)(bVar33 & 1) * piVar1[8];
      auVar61._36_4_ = (uint)(bVar33 >> 1 & 1) * piVar1[9];
      auVar61._40_4_ = (uint)(bVar33 >> 2 & 1) * piVar1[10];
      auVar61._44_4_ = (uint)(bVar33 >> 3 & 1) * piVar1[0xb];
      auVar61._48_4_ = (uint)(bVar33 >> 4 & 1) * piVar1[0xc];
      auVar61._52_4_ = (uint)(bVar33 >> 5 & 1) * piVar1[0xd];
      auVar61._56_4_ = (uint)(bVar33 >> 6 & 1) * piVar1[0xe];
      auVar61._60_4_ = (uint)(bVar33 >> 7) * piVar1[0xf];
      auVar61 = vaddps_avx512f(auVar61,auVar51);
      uVar36 = uVar36 + 0x10;
    } while (((ulong)(~uVar37 + uVar34) + 0x10 & 0x1fffffff0) != uVar36);
    auVar47._0_4_ = (uint)(bVar32 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar51._0_4_;
    bVar5 = (bool)((byte)(uVar41 >> 1) & 1);
    auVar47._4_4_ = (uint)bVar5 * auVar61._4_4_ | (uint)!bVar5 * auVar51._4_4_;
    bVar5 = (bool)((byte)(uVar41 >> 2) & 1);
    auVar47._8_4_ = (uint)bVar5 * auVar61._8_4_ | (uint)!bVar5 * auVar51._8_4_;
    bVar5 = (bool)((byte)(uVar41 >> 3) & 1);
    auVar47._12_4_ = (uint)bVar5 * auVar61._12_4_ | (uint)!bVar5 * auVar51._12_4_;
    bVar5 = (bool)((byte)(uVar41 >> 4) & 1);
    auVar47._16_4_ = (uint)bVar5 * auVar61._16_4_ | (uint)!bVar5 * auVar51._16_4_;
    bVar5 = (bool)((byte)(uVar41 >> 5) & 1);
    auVar47._20_4_ = (uint)bVar5 * auVar61._20_4_ | (uint)!bVar5 * auVar51._20_4_;
    bVar5 = (bool)((byte)(uVar41 >> 6) & 1);
    auVar47._24_4_ = (uint)bVar5 * auVar61._24_4_ | (uint)!bVar5 * auVar51._24_4_;
    bVar5 = (bool)((byte)(uVar41 >> 7) & 1);
    auVar47._28_4_ = (uint)bVar5 * auVar61._28_4_ | (uint)!bVar5 * auVar51._28_4_;
    auVar47._32_4_ =
         (uint)(bVar33 & 1) * auVar61._32_4_ | (uint)!(bool)(bVar33 & 1) * auVar51._32_4_;
    bVar5 = (bool)(bVar33 >> 1 & 1);
    auVar47._36_4_ = (uint)bVar5 * auVar61._36_4_ | (uint)!bVar5 * auVar51._36_4_;
    bVar5 = (bool)(bVar33 >> 2 & 1);
    auVar47._40_4_ = (uint)bVar5 * auVar61._40_4_ | (uint)!bVar5 * auVar51._40_4_;
    bVar5 = (bool)(bVar33 >> 3 & 1);
    auVar47._44_4_ = (uint)bVar5 * auVar61._44_4_ | (uint)!bVar5 * auVar51._44_4_;
    bVar5 = (bool)(bVar33 >> 4 & 1);
    auVar47._48_4_ = (uint)bVar5 * auVar61._48_4_ | (uint)!bVar5 * auVar51._48_4_;
    bVar5 = (bool)(bVar33 >> 5 & 1);
    auVar47._52_4_ = (uint)bVar5 * auVar61._52_4_ | (uint)!bVar5 * auVar51._52_4_;
    bVar5 = (bool)(bVar33 >> 6 & 1);
    auVar47._56_4_ = (uint)bVar5 * auVar61._56_4_ | (uint)!bVar5 * auVar51._56_4_;
    auVar47._60_4_ =
         (uint)(bVar33 >> 7) * auVar61._60_4_ | (uint)!(bool)(bVar33 >> 7) * auVar51._60_4_;
    auVar44 = vextractf64x4_avx512f(auVar47,1);
    auVar61 = vaddps_avx512f(auVar47,ZEXT3264(auVar44));
    auVar54._0_4_ = auVar61._0_4_ + auVar61._16_4_;
    auVar54._4_4_ = auVar61._4_4_ + auVar61._20_4_;
    auVar54._8_4_ = auVar61._8_4_ + auVar61._24_4_;
    auVar54._12_4_ = auVar61._12_4_ + auVar61._28_4_;
    auVar56 = vshufpd_avx(auVar54,auVar54,1);
    auVar55._0_4_ = auVar54._0_4_ + auVar56._0_4_;
    auVar55._4_4_ = auVar54._4_4_ + auVar56._4_4_;
    auVar55._8_4_ = auVar54._8_4_ + auVar56._8_4_;
    auVar55._12_4_ = auVar54._12_4_ + auVar56._12_4_;
    auVar56 = vhaddps_avx(auVar55,auVar55);
  }
  if (elempack == 0x10) {
    auVar61 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar74 = vmulps_avx512f(auVar74,auVar61);
  }
  if (elempack == 8) {
    auVar45 = vextractf64x4_avx512f(auVar74,1);
    fVar71 = 1.0 / (float)elemcount;
    auVar44._4_4_ = (auVar74._4_4_ + auVar69._4_4_ + auVar45._4_4_) * fVar71;
    auVar44._0_4_ = (auVar74._0_4_ + auVar69._0_4_ + auVar45._0_4_) * fVar71;
    auVar44._8_4_ = (auVar74._8_4_ + auVar69._8_4_ + auVar45._8_4_) * fVar71;
    auVar44._12_4_ = (auVar74._12_4_ + auVar69._12_4_ + auVar45._12_4_) * fVar71;
    auVar44._16_4_ = (auVar74._16_4_ + auVar69._16_4_ + auVar45._16_4_) * fVar71;
    auVar44._20_4_ = (auVar74._20_4_ + auVar69._20_4_ + auVar45._20_4_) * fVar71;
    auVar44._24_4_ = (auVar74._24_4_ + auVar69._24_4_ + auVar45._24_4_) * fVar71;
    auVar44._28_4_ = auVar74._28_4_ + auVar69._28_4_ + auVar45._28_4_;
    auVar69 = ZEXT3264(auVar44);
    auVar74 = vinsertf64x4_avx512f(auVar69,auVar44,1);
  }
  if (elempack == 4) {
    auVar44 = vextractf64x4_avx512f(auVar74,1);
    fVar70 = auVar74._4_4_ + auVar69._4_4_ + auVar44._4_4_;
    fVar71 = auVar42._4_4_;
    fVar18 = auVar42._8_4_;
    fVar19 = auVar42._12_4_;
    fVar62 = 1.0 / (float)elemcount;
    auVar42._0_4_ =
         (auVar74._0_4_ + auVar69._0_4_ + auVar44._0_4_ +
          auVar74._16_4_ + auVar69._16_4_ + auVar44._16_4_ + auVar42._0_4_) * fVar62;
    auVar42._4_4_ = (fVar70 + fVar70 + fVar71) * fVar62;
    auVar42._8_4_ =
         (auVar74._8_4_ + auVar69._8_4_ + auVar44._8_4_ +
          auVar74._24_4_ + auVar69._24_4_ + auVar44._24_4_ + fVar18) * fVar62;
    auVar42._12_4_ =
         (auVar74._12_4_ + auVar69._12_4_ + auVar44._12_4_ +
          auVar74._28_4_ + auVar69._28_4_ + auVar44._28_4_ + fVar19) * fVar62;
    auVar69 = ZEXT3264(CONCAT1616(auVar42,auVar42));
    auVar74 = vshuff64x2_avx512f(ZEXT1664(auVar42),ZEXT1664(auVar42),0);
  }
  if (elempack == 1) {
    auVar44 = vextractf64x4_avx512f(auVar74,1);
    fVar71 = auVar74._4_4_ + auVar44._4_4_;
    auVar72._0_4_ = auVar74._0_4_ + auVar44._0_4_ + auVar74._16_4_ + auVar44._16_4_;
    auVar72._4_4_ = fVar71 + fVar71;
    auVar72._8_4_ = auVar74._8_4_ + auVar44._8_4_ + auVar74._24_4_ + auVar44._24_4_;
    auVar72._12_4_ = auVar74._12_4_ + auVar44._12_4_ + auVar74._28_4_ + auVar44._28_4_;
    auVar63._0_4_ = auVar69._16_4_ + auVar69._0_4_;
    auVar63._4_4_ = auVar69._20_4_ + auVar69._4_4_;
    auVar63._8_4_ = auVar69._24_4_ + auVar69._8_4_;
    auVar63._12_4_ = auVar69._28_4_ + auVar69._12_4_;
    auVar55 = vshufpd_avx(auVar42,auVar42,1);
    auVar54 = vshufps_avx(auVar72,auVar63,0x11);
    auVar43 = vshufps_avx(auVar72,auVar63,0xbb);
    auVar64._0_4_ = auVar43._0_4_ + auVar54._0_4_;
    auVar64._4_4_ = auVar43._4_4_ + auVar54._4_4_;
    auVar64._8_4_ = auVar43._8_4_ + auVar54._8_4_;
    auVar64._12_4_ = auVar43._12_4_ + auVar54._12_4_;
    auVar54 = vshufpd_avx(auVar64,auVar64,1);
    auVar65._0_4_ = auVar64._0_4_ + auVar54._0_4_;
    auVar65._4_4_ = auVar64._4_4_ + auVar54._4_4_;
    auVar65._8_4_ = auVar64._8_4_ + auVar54._8_4_;
    auVar65._12_4_ = auVar64._12_4_ + auVar54._12_4_;
    auVar54 = vhaddps_avx(auVar65,auVar65);
    auVar43._0_4_ = auVar55._0_4_ + auVar42._0_4_;
    auVar43._4_4_ = auVar55._4_4_ + auVar42._4_4_;
    auVar43._8_4_ = auVar55._8_4_ + auVar42._8_4_;
    auVar43._12_4_ = auVar55._12_4_ + auVar42._12_4_;
    auVar42 = vmovshdup_avx(auVar43);
    auVar56._0_4_ =
         (auVar42._0_4_ + auVar43._0_4_ + auVar56._0_4_ + auVar54._0_4_) / (float)elemcount;
    auVar56._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar74 = vbroadcastss_avx512f(auVar56);
    auVar42 = auVar74._0_16_;
    auVar69 = ZEXT3264(auVar74._0_32_);
  }
  auVar45 = auVar69._0_32_;
  pauVar39 = (undefined1 (*) [64])ptr;
  if ((int)uVar34 < 0x10) {
    auVar61 = ZEXT864(0);
    uVar37 = 0;
  }
  else {
    uVar37 = uVar34 & 0x7ffffff0;
    auVar61 = ZEXT864(0);
    iVar40 = 0xf;
    do {
      auVar47 = vsubps_avx512f(*pauVar39,auVar74);
      auVar61 = vfmadd231ps_avx512f(auVar61,auVar47,auVar47);
      pauVar39 = pauVar39 + 1;
      iVar40 = iVar40 + 0x10;
    } while (iVar40 < (int)uVar34);
  }
  auVar76 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  if ((int)(uVar37 | 7) < (int)uVar34) {
    auVar47 = ZEXT1664((undefined1  [16])0x0);
    uVar38 = uVar37;
    do {
      auVar44 = vsubps_avx(*(undefined1 (*) [32])*pauVar39,auVar45);
      auVar54 = vfmadd231ps_fma(auVar47._0_32_,auVar44,auVar44);
      auVar47 = ZEXT1664(auVar54);
      auVar76 = ZEXT1632(auVar54);
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
      uVar37 = uVar38 + 8;
      iVar40 = uVar38 + 0xf;
      uVar38 = uVar37;
    } while (iVar40 < (int)uVar34);
  }
  auVar54 = ZEXT816(0) << 0x40;
  if ((int)(uVar37 | 3) < (int)uVar34) {
    auVar47 = ZEXT464(0) << 0x40;
    uVar38 = uVar37;
    do {
      auVar54 = vsubps_avx(*(undefined1 (*) [16])*pauVar39,auVar42);
      auVar54 = vfmadd231ps_fma(auVar47._0_16_,auVar54,auVar54);
      auVar47 = ZEXT1664(auVar54);
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
      uVar37 = uVar38 + 4;
      iVar40 = uVar38 + 7;
      uVar38 = uVar37;
    } while (iVar40 < (int)uVar34);
  }
  auVar55 = ZEXT816(0) << 0x40;
  if ((int)uVar37 < (int)uVar34) {
    auVar48 = vpbroadcastq_avx512f();
    auVar49 = vbroadcastss_avx512f(auVar56);
    uVar36 = 0;
    auVar50 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar51 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar89 = auVar47;
      auVar47 = vpbroadcastq_avx512f();
      auVar52 = vporq_avx512f(auVar47,auVar50);
      auVar47 = vporq_avx512f(auVar47,auVar51);
      uVar20 = vpcmpuq_avx512f(auVar47,auVar48,2);
      bVar32 = (byte)uVar20;
      uVar20 = vpcmpuq_avx512f(auVar52,auVar48,2);
      bVar33 = (byte)uVar20;
      uVar41 = CONCAT11(bVar33,bVar32);
      piVar1 = (int *)(*pauVar39 + uVar36 * 4);
      auVar52._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * piVar1[1];
      auVar52._0_4_ = (uint)(bVar32 & 1) * *piVar1;
      auVar52._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * piVar1[2];
      auVar52._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * piVar1[3];
      auVar52._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * piVar1[4];
      auVar52._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * piVar1[5];
      auVar52._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * piVar1[6];
      auVar52._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * piVar1[7];
      auVar52._32_4_ = (uint)(bVar33 & 1) * piVar1[8];
      auVar52._36_4_ = (uint)(bVar33 >> 1 & 1) * piVar1[9];
      auVar52._40_4_ = (uint)(bVar33 >> 2 & 1) * piVar1[10];
      auVar52._44_4_ = (uint)(bVar33 >> 3 & 1) * piVar1[0xb];
      auVar52._48_4_ = (uint)(bVar33 >> 4 & 1) * piVar1[0xc];
      auVar52._52_4_ = (uint)(bVar33 >> 5 & 1) * piVar1[0xd];
      auVar52._56_4_ = (uint)(bVar33 >> 6 & 1) * piVar1[0xe];
      auVar52._60_4_ = (uint)(bVar33 >> 7) * piVar1[0xf];
      auVar47 = vsubps_avx512f(auVar52,auVar49);
      auVar47 = vfmadd213ps_avx512f(auVar47,auVar47,auVar89);
      uVar36 = uVar36 + 0x10;
    } while (((ulong)(~uVar37 + uVar34) + 0x10 & 0x1fffffff0) != uVar36);
    auVar48._0_4_ = (uint)(bVar32 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar89._0_4_;
    bVar5 = (bool)((byte)(uVar41 >> 1) & 1);
    auVar48._4_4_ = (uint)bVar5 * auVar47._4_4_ | (uint)!bVar5 * auVar89._4_4_;
    bVar5 = (bool)((byte)(uVar41 >> 2) & 1);
    auVar48._8_4_ = (uint)bVar5 * auVar47._8_4_ | (uint)!bVar5 * auVar89._8_4_;
    bVar5 = (bool)((byte)(uVar41 >> 3) & 1);
    auVar48._12_4_ = (uint)bVar5 * auVar47._12_4_ | (uint)!bVar5 * auVar89._12_4_;
    bVar5 = (bool)((byte)(uVar41 >> 4) & 1);
    auVar48._16_4_ = (uint)bVar5 * auVar47._16_4_ | (uint)!bVar5 * auVar89._16_4_;
    bVar5 = (bool)((byte)(uVar41 >> 5) & 1);
    auVar48._20_4_ = (uint)bVar5 * auVar47._20_4_ | (uint)!bVar5 * auVar89._20_4_;
    bVar5 = (bool)((byte)(uVar41 >> 6) & 1);
    auVar48._24_4_ = (uint)bVar5 * auVar47._24_4_ | (uint)!bVar5 * auVar89._24_4_;
    bVar5 = (bool)((byte)(uVar41 >> 7) & 1);
    auVar48._28_4_ = (uint)bVar5 * auVar47._28_4_ | (uint)!bVar5 * auVar89._28_4_;
    auVar48._32_4_ =
         (uint)(bVar33 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar33 & 1) * auVar89._32_4_;
    bVar5 = (bool)(bVar33 >> 1 & 1);
    auVar48._36_4_ = (uint)bVar5 * auVar47._36_4_ | (uint)!bVar5 * auVar89._36_4_;
    bVar5 = (bool)(bVar33 >> 2 & 1);
    auVar48._40_4_ = (uint)bVar5 * auVar47._40_4_ | (uint)!bVar5 * auVar89._40_4_;
    bVar5 = (bool)(bVar33 >> 3 & 1);
    auVar48._44_4_ = (uint)bVar5 * auVar47._44_4_ | (uint)!bVar5 * auVar89._44_4_;
    bVar5 = (bool)(bVar33 >> 4 & 1);
    auVar48._48_4_ = (uint)bVar5 * auVar47._48_4_ | (uint)!bVar5 * auVar89._48_4_;
    bVar5 = (bool)(bVar33 >> 5 & 1);
    auVar48._52_4_ = (uint)bVar5 * auVar47._52_4_ | (uint)!bVar5 * auVar89._52_4_;
    bVar5 = (bool)(bVar33 >> 6 & 1);
    auVar48._56_4_ = (uint)bVar5 * auVar47._56_4_ | (uint)!bVar5 * auVar89._56_4_;
    auVar48._60_4_ =
         (uint)(bVar33 >> 7) * auVar47._60_4_ | (uint)!(bool)(bVar33 >> 7) * auVar89._60_4_;
    auVar44 = vextractf64x4_avx512f(auVar48,1);
    auVar47 = vaddps_avx512f(auVar48,ZEXT3264(auVar44));
    auVar77._0_4_ = auVar47._16_4_ + auVar47._0_4_;
    auVar77._4_4_ = auVar47._20_4_ + auVar47._4_4_;
    auVar77._8_4_ = auVar47._24_4_ + auVar47._8_4_;
    auVar77._12_4_ = auVar47._28_4_ + auVar47._12_4_;
    auVar55 = vshufpd_avx(auVar77,auVar77,1);
    auVar78._0_4_ = auVar55._0_4_ + auVar77._0_4_;
    auVar78._4_4_ = auVar55._4_4_ + auVar77._4_4_;
    auVar78._8_4_ = auVar55._8_4_ + auVar77._8_4_;
    auVar78._12_4_ = auVar55._12_4_ + auVar77._12_4_;
    auVar55 = vhaddps_avx(auVar78,auVar78);
  }
  if (elempack == 0x10) {
    auVar53 = vbroadcastss_avx512f(auVar53._0_16_);
    auVar47 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar53 = vfmadd213ps_avx512f(auVar47,auVar61,auVar53);
    auVar44 = vrsqrtps_avx(auVar53._0_32_);
    auVar46 = vextractf64x4_avx512f(auVar53,1);
    auVar46 = vrsqrtps_avx(auVar46);
    auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar44),auVar46,1);
    auVar74 = vmulps_avx512f(auVar61,auVar74);
  }
  if (elempack == 8) {
    auVar44 = vextractf64x4_avx512f(auVar61,1);
    auVar46._0_4_ = auVar61._0_4_ + auVar76._0_4_ + auVar44._0_4_;
    auVar46._4_4_ = auVar61._4_4_ + auVar76._4_4_ + auVar44._4_4_;
    auVar46._8_4_ = auVar61._8_4_ + auVar76._8_4_ + auVar44._8_4_;
    auVar46._12_4_ = auVar61._12_4_ + auVar76._12_4_ + auVar44._12_4_;
    auVar46._16_4_ = auVar61._16_4_ + auVar76._16_4_ + auVar44._16_4_;
    auVar46._20_4_ = auVar61._20_4_ + auVar76._20_4_ + auVar44._20_4_;
    auVar46._24_4_ = auVar61._24_4_ + auVar76._24_4_ + auVar44._24_4_;
    auVar46._28_4_ = auVar61._28_4_ + auVar76._28_4_ + auVar44._28_4_;
    auVar80._4_4_ = eps;
    auVar80._0_4_ = eps;
    auVar80._8_4_ = eps;
    auVar80._12_4_ = eps;
    auVar80._16_4_ = eps;
    auVar80._20_4_ = eps;
    auVar80._24_4_ = eps;
    auVar80._28_4_ = eps;
    auVar79._0_4_ = 1.0 / (float)elemcount;
    auVar79._4_4_ = auVar79._0_4_;
    auVar79._8_4_ = auVar79._0_4_;
    auVar79._12_4_ = auVar79._0_4_;
    auVar79._16_4_ = auVar79._0_4_;
    auVar79._20_4_ = auVar79._0_4_;
    auVar79._24_4_ = auVar79._0_4_;
    auVar79._28_4_ = auVar79._0_4_;
    auVar43 = vfmadd213ps_fma(auVar79,auVar46,auVar80);
    auVar76 = vrsqrtps_avx(ZEXT1632(auVar43));
    auVar74._0_4_ = auVar76._0_4_ * auVar69._0_4_;
    auVar74._4_4_ = auVar76._4_4_ * auVar69._4_4_;
    auVar74._8_4_ = auVar76._8_4_ * auVar69._8_4_;
    auVar74._12_4_ = auVar76._12_4_ * auVar69._12_4_;
    auVar74._16_4_ = auVar76._16_4_ * auVar69._16_4_;
    auVar74._20_4_ = auVar76._20_4_ * auVar69._20_4_;
    auVar74._28_36_ = auVar69._28_36_;
    auVar74._24_4_ = auVar76._24_4_ * auVar69._24_4_;
    auVar45 = auVar74._0_32_;
    auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar76),auVar76,1);
    auVar74 = vinsertf64x4_avx512f(ZEXT3264(auVar45),auVar45,1);
  }
  auVar57 = auVar42;
  if (elempack == 4) {
    auVar44 = vextractf64x4_avx512f(auVar61,1);
    fVar71 = auVar61._4_4_ + auVar76._4_4_ + auVar44._4_4_;
    auVar66._0_4_ =
         auVar61._0_4_ + auVar76._0_4_ + auVar44._0_4_ +
         auVar61._16_4_ + auVar76._16_4_ + auVar44._16_4_ + auVar54._0_4_;
    auVar66._4_4_ = fVar71 + fVar71 + auVar54._4_4_;
    auVar66._8_4_ =
         auVar61._8_4_ + auVar76._8_4_ + auVar44._8_4_ +
         auVar61._24_4_ + auVar76._24_4_ + auVar44._24_4_ + auVar54._8_4_;
    auVar66._12_4_ =
         auVar61._12_4_ + auVar76._12_4_ + auVar44._12_4_ +
         auVar61._28_4_ + auVar76._28_4_ + auVar44._28_4_ + auVar54._12_4_;
    auVar75._4_4_ = eps;
    auVar75._0_4_ = eps;
    auVar75._8_4_ = eps;
    auVar75._12_4_ = eps;
    auVar73._0_4_ = 1.0 / (float)elemcount;
    auVar73._4_4_ = auVar73._0_4_;
    auVar73._8_4_ = auVar73._0_4_;
    auVar73._12_4_ = auVar73._0_4_;
    auVar54 = vfmadd213ps_fma(auVar73,auVar66,auVar75);
    auVar54 = vrsqrtps_avx(auVar54);
    auVar57._0_4_ = auVar54._0_4_ * auVar42._0_4_;
    auVar57._4_4_ = auVar54._4_4_ * auVar42._4_4_;
    auVar57._8_4_ = auVar54._8_4_ * auVar42._8_4_;
    auVar57._12_4_ = auVar54._12_4_ * auVar42._12_4_;
    auVar76._16_16_ = auVar54;
    auVar76._0_16_ = auVar54;
    auVar45._16_16_ = auVar57;
    auVar45._0_16_ = auVar57;
    auVar61 = vshuff64x2_avx512f(ZEXT1664(auVar54),ZEXT1664(auVar54),0);
    auVar74 = vshuff64x2_avx512f(ZEXT1664(auVar57),ZEXT1664(auVar57),0);
  }
  if (elempack == 1) {
    auVar44 = vextractf64x4_avx512f(auVar61,1);
    fVar71 = auVar61._4_4_ + auVar44._4_4_;
    auVar58._0_4_ = auVar61._0_4_ + auVar44._0_4_ + auVar61._16_4_ + auVar44._16_4_;
    auVar58._4_4_ = fVar71 + fVar71;
    auVar58._8_4_ = auVar61._8_4_ + auVar44._8_4_ + auVar61._24_4_ + auVar44._24_4_;
    auVar58._12_4_ = auVar61._12_4_ + auVar44._12_4_ + auVar61._28_4_ + auVar44._28_4_;
    auVar67._0_4_ = auVar76._16_4_ + auVar76._0_4_;
    auVar67._4_4_ = auVar76._20_4_ + auVar76._4_4_;
    auVar67._8_4_ = auVar76._24_4_ + auVar76._8_4_;
    auVar67._12_4_ = auVar76._28_4_ + auVar76._12_4_;
    auVar43 = vshufpd_avx(auVar54,auVar54,1);
    auVar42 = vshufps_avx(auVar58,auVar67,0x11);
    auVar63 = vshufps_avx(auVar58,auVar67,0xbb);
    auVar59._0_4_ = auVar63._0_4_ + auVar42._0_4_;
    auVar59._4_4_ = auVar63._4_4_ + auVar42._4_4_;
    auVar59._8_4_ = auVar63._8_4_ + auVar42._8_4_;
    auVar59._12_4_ = auVar63._12_4_ + auVar42._12_4_;
    auVar42 = vshufpd_avx(auVar59,auVar59,1);
    auVar60._0_4_ = auVar59._0_4_ + auVar42._0_4_;
    auVar60._4_4_ = auVar59._4_4_ + auVar42._4_4_;
    auVar60._8_4_ = auVar59._8_4_ + auVar42._8_4_;
    auVar60._12_4_ = auVar59._12_4_ + auVar42._12_4_;
    auVar42 = vhaddps_avx(auVar60,auVar60);
    auVar68._0_4_ = auVar43._0_4_ + auVar54._0_4_;
    auVar68._4_4_ = auVar43._4_4_ + auVar54._4_4_;
    auVar68._8_4_ = auVar43._8_4_ + auVar54._8_4_;
    auVar68._12_4_ = auVar43._12_4_ + auVar54._12_4_;
    auVar54 = vmovshdup_avx(auVar68);
    auVar42 = ZEXT416((uint)((auVar54._0_4_ + auVar42._0_4_ + auVar68._0_4_ + auVar55._0_4_) /
                             (float)elemcount + eps));
    auVar42 = vsqrtss_avx(auVar42,auVar42);
    fVar71 = 1.0 / auVar42._0_4_;
    auVar55 = ZEXT416((uint)fVar71);
    fVar71 = fVar71 * auVar56._0_4_;
    auVar56 = ZEXT416((uint)fVar71);
    auVar61 = vbroadcastss_avx512f(auVar55);
    auVar54 = auVar61._0_16_;
    auVar74 = vbroadcastss_avx512f(ZEXT416((uint)fVar71));
    auVar57 = auVar74._0_16_;
    auVar76 = auVar61._0_32_;
    auVar45 = auVar74._0_32_;
  }
  if (gamma_ptr == (float *)0x0 || beta_ptr == (float *)0x0) {
    uVar37 = 0;
    if (0xf < (int)uVar34) {
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar69._16_4_ = 0x80000000;
      auVar69._20_4_ = 0x80000000;
      auVar69._24_4_ = 0x80000000;
      auVar69._28_4_ = 0x80000000;
      auVar69._32_4_ = 0x80000000;
      auVar69._36_4_ = 0x80000000;
      auVar69._40_4_ = 0x80000000;
      auVar69._44_4_ = 0x80000000;
      auVar69._48_4_ = 0x80000000;
      auVar69._52_4_ = 0x80000000;
      auVar69._56_4_ = 0x80000000;
      auVar69._60_4_ = 0x80000000;
      auVar53 = vxorps_avx512dq(auVar74,auVar69);
      uVar37 = uVar34 & 0x7ffffff0;
      iVar40 = 0xf;
      do {
        auVar74 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar53,auVar61);
        *(undefined1 (*) [64])ptr = auVar74;
        ptr = (float *)((long)ptr + 0x40);
        iVar40 = iVar40 + 0x10;
      } while (iVar40 < (int)uVar34);
    }
    if ((int)(uVar37 | 7) < (int)uVar34) {
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar44 = vxorps_avx512vl(auVar45,auVar29);
      uVar38 = uVar37;
      do {
        auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar44,auVar76);
        *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar42);
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        uVar37 = uVar38 + 8;
        iVar40 = uVar38 + 0xf;
        uVar38 = uVar37;
      } while (iVar40 < (int)uVar34);
    }
    if ((int)(uVar37 | 3) < (int)uVar34) {
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar42 = vxorps_avx512vl(auVar57,auVar24);
      uVar38 = uVar37;
      do {
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar42,auVar54);
        *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar43;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        uVar37 = uVar38 + 4;
        iVar40 = uVar38 + 7;
        uVar38 = uVar37;
      } while (iVar40 < (int)uVar34);
    }
    if ((int)uVar37 < (int)uVar34) {
      auVar53 = vpbroadcastq_avx512f();
      auVar74 = vbroadcastss_avx512f(auVar55);
      auVar69 = vbroadcastss_avx512f(auVar56);
      uVar36 = 0;
      auVar61 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar48 = vpbroadcastq_avx512f();
        auVar49 = vporq_avx512f(auVar48,auVar61);
        auVar48 = vporq_avx512f(auVar48,auVar47);
        uVar20 = vpcmpuq_avx512f(auVar48,auVar53,2);
        bVar32 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar49,auVar53,2);
        bVar33 = (byte)uVar20;
        uVar41 = CONCAT11(bVar33,bVar32);
        piVar1 = (int *)(*(undefined1 (*) [64])ptr + uVar36 * 4);
        auVar49._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * piVar1[1];
        auVar49._0_4_ = (uint)(bVar32 & 1) * *piVar1;
        auVar49._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * piVar1[2];
        auVar49._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * piVar1[3];
        auVar49._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * piVar1[4];
        auVar49._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * piVar1[5];
        auVar49._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * piVar1[6];
        auVar49._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * piVar1[7];
        auVar49._32_4_ = (uint)(bVar33 & 1) * piVar1[8];
        auVar49._36_4_ = (uint)(bVar33 >> 1 & 1) * piVar1[9];
        auVar49._40_4_ = (uint)(bVar33 >> 2 & 1) * piVar1[10];
        auVar49._44_4_ = (uint)(bVar33 >> 3 & 1) * piVar1[0xb];
        auVar49._48_4_ = (uint)(bVar33 >> 4 & 1) * piVar1[0xc];
        auVar49._52_4_ = (uint)(bVar33 >> 5 & 1) * piVar1[0xd];
        auVar49._56_4_ = (uint)(bVar33 >> 6 & 1) * piVar1[0xe];
        auVar49._60_4_ = (uint)(bVar33 >> 7) * piVar1[0xf];
        auVar48 = vfmsub213ps_avx512f(auVar49,auVar74,auVar69);
        puVar2 = (uint *)(*(undefined1 (*) [64])ptr + uVar36 * 4);
        bVar5 = (bool)((byte)(uVar41 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar41 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar41 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar41 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar41 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar41 >> 6) & 1);
        bVar11 = (bool)((byte)(uVar41 >> 7) & 1);
        bVar12 = (bool)(bVar33 >> 1 & 1);
        bVar13 = (bool)(bVar33 >> 2 & 1);
        bVar14 = (bool)(bVar33 >> 3 & 1);
        bVar15 = (bool)(bVar33 >> 4 & 1);
        bVar16 = (bool)(bVar33 >> 5 & 1);
        bVar17 = (bool)(bVar33 >> 6 & 1);
        *puVar2 = (uint)(bVar32 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar32 & 1) * *puVar2;
        puVar2[1] = (uint)bVar5 * auVar48._4_4_ | (uint)!bVar5 * puVar2[1];
        puVar2[2] = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * puVar2[2];
        puVar2[3] = (uint)bVar7 * auVar48._12_4_ | (uint)!bVar7 * puVar2[3];
        puVar2[4] = (uint)bVar8 * auVar48._16_4_ | (uint)!bVar8 * puVar2[4];
        puVar2[5] = (uint)bVar9 * auVar48._20_4_ | (uint)!bVar9 * puVar2[5];
        puVar2[6] = (uint)bVar10 * auVar48._24_4_ | (uint)!bVar10 * puVar2[6];
        puVar2[7] = (uint)bVar11 * auVar48._28_4_ | (uint)!bVar11 * puVar2[7];
        puVar2[8] = (uint)(bVar33 & 1) * auVar48._32_4_ | (uint)!(bool)(bVar33 & 1) * puVar2[8];
        puVar2[9] = (uint)bVar12 * auVar48._36_4_ | (uint)!bVar12 * puVar2[9];
        puVar2[10] = (uint)bVar13 * auVar48._40_4_ | (uint)!bVar13 * puVar2[10];
        puVar2[0xb] = (uint)bVar14 * auVar48._44_4_ | (uint)!bVar14 * puVar2[0xb];
        puVar2[0xc] = (uint)bVar15 * auVar48._48_4_ | (uint)!bVar15 * puVar2[0xc];
        puVar2[0xd] = (uint)bVar16 * auVar48._52_4_ | (uint)!bVar16 * puVar2[0xd];
        puVar2[0xe] = (uint)bVar17 * auVar48._56_4_ | (uint)!bVar17 * puVar2[0xe];
        puVar2[0xf] = (uint)(bVar33 >> 7) * auVar48._60_4_ |
                      (uint)!(bool)(bVar33 >> 7) * puVar2[0xf];
        uVar36 = uVar36 + 0x10;
      } while (((ulong)(uVar34 + ~uVar37) + 0x10 & 0x1fffffff0) != uVar36);
    }
  }
  else {
    uVar37 = 0;
    if (elempack == 0x10 && 0xf < (int)uVar34) {
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      auVar50._16_4_ = 0x80000000;
      auVar50._20_4_ = 0x80000000;
      auVar50._24_4_ = 0x80000000;
      auVar50._28_4_ = 0x80000000;
      auVar50._32_4_ = 0x80000000;
      auVar50._36_4_ = 0x80000000;
      auVar50._40_4_ = 0x80000000;
      auVar50._44_4_ = 0x80000000;
      auVar50._48_4_ = 0x80000000;
      auVar50._52_4_ = 0x80000000;
      auVar50._56_4_ = 0x80000000;
      auVar50._60_4_ = 0x80000000;
      auVar53 = vxorps_avx512dq(auVar74,auVar50);
      iVar40 = 0xf;
      do {
        auVar69 = vbroadcastss_avx512f(ZEXT416(*(uint *)*(undefined1 (*) [64])gamma_ptr));
        auVar47 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar53,auVar61);
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
        auVar51._4_4_ = uVar3;
        auVar51._0_4_ = uVar3;
        auVar51._8_4_ = uVar3;
        auVar51._12_4_ = uVar3;
        auVar51._16_4_ = uVar3;
        auVar51._20_4_ = uVar3;
        auVar51._24_4_ = uVar3;
        auVar51._28_4_ = uVar3;
        auVar51._32_4_ = uVar3;
        auVar51._36_4_ = uVar3;
        auVar51._40_4_ = uVar3;
        auVar51._44_4_ = uVar3;
        auVar51._48_4_ = uVar3;
        auVar51._52_4_ = uVar3;
        auVar51._56_4_ = uVar3;
        auVar51._60_4_ = uVar3;
        auVar69 = vfmadd213ps_avx512f(auVar47,auVar69,auVar51);
        *(undefined1 (*) [64])ptr = auVar69;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 4);
        iVar40 = iVar40 + 0x10;
        uVar37 = uVar34;
      } while (iVar40 < (int)uVar34);
    }
    if (elempack == 8) {
      if ((int)(uVar37 | 0xf) < (int)uVar34) {
        auVar89._8_4_ = 0x80000000;
        auVar89._0_8_ = 0x8000000080000000;
        auVar89._12_4_ = 0x80000000;
        auVar89._16_4_ = 0x80000000;
        auVar89._20_4_ = 0x80000000;
        auVar89._24_4_ = 0x80000000;
        auVar89._28_4_ = 0x80000000;
        auVar89._32_4_ = 0x80000000;
        auVar89._36_4_ = 0x80000000;
        auVar89._40_4_ = 0x80000000;
        auVar89._44_4_ = 0x80000000;
        auVar89._48_4_ = 0x80000000;
        auVar89._52_4_ = 0x80000000;
        auVar89._56_4_ = 0x80000000;
        auVar89._60_4_ = 0x80000000;
        auVar53 = vxorps_avx512dq(auVar74,auVar89);
        uVar38 = uVar37;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
          auVar85._4_4_ = uVar4;
          auVar85._0_4_ = uVar4;
          auVar85._8_4_ = uVar4;
          auVar85._12_4_ = uVar4;
          auVar85._16_4_ = uVar4;
          auVar85._20_4_ = uVar4;
          auVar85._24_4_ = uVar4;
          auVar85._28_4_ = uVar4;
          auVar69 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(
                                                  uVar3,CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3)))))))),auVar85,1);
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 4);
          auVar88._4_4_ = uVar4;
          auVar88._0_4_ = uVar4;
          auVar88._8_4_ = uVar4;
          auVar88._12_4_ = uVar4;
          auVar88._16_4_ = uVar4;
          auVar88._20_4_ = uVar4;
          auVar88._24_4_ = uVar4;
          auVar88._28_4_ = uVar4;
          auVar47 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(
                                                  uVar3,CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3)))))))),auVar88,1);
          auVar48 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar53,auVar61);
          auVar69 = vfmadd213ps_avx512f(auVar48,auVar69,auVar47);
          *(undefined1 (*) [64])ptr = auVar69;
          ptr = (float *)((long)ptr + 0x40);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 8);
          uVar37 = uVar38 + 0x10;
          iVar40 = uVar38 + 0x1f;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
      if ((int)(uVar37 | 7) < (int)uVar34) {
        auVar25._8_4_ = 0x80000000;
        auVar25._0_8_ = 0x8000000080000000;
        auVar25._12_4_ = 0x80000000;
        auVar25._16_4_ = 0x80000000;
        auVar25._20_4_ = 0x80000000;
        auVar25._24_4_ = 0x80000000;
        auVar25._28_4_ = 0x80000000;
        auVar44 = vxorps_avx512vl(auVar45,auVar25);
        uVar38 = uVar37;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          auVar82._4_4_ = uVar3;
          auVar82._0_4_ = uVar3;
          auVar82._8_4_ = uVar3;
          auVar82._12_4_ = uVar3;
          auVar82._16_4_ = uVar3;
          auVar82._20_4_ = uVar3;
          auVar82._24_4_ = uVar3;
          auVar82._28_4_ = uVar3;
          auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar44,auVar76)
          ;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          auVar26._4_4_ = uVar3;
          auVar26._0_4_ = uVar3;
          auVar26._8_4_ = uVar3;
          auVar26._12_4_ = uVar3;
          auVar26._16_4_ = uVar3;
          auVar26._20_4_ = uVar3;
          auVar26._24_4_ = uVar3;
          auVar26._28_4_ = uVar3;
          auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar82,auVar26);
          *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar46;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 4);
          uVar37 = uVar38 + 8;
          iVar40 = uVar38 + 0xf;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
    }
    if (elempack == 4) {
      if ((int)(uVar37 + 0xf) < (int)uVar34) {
        auVar30._8_4_ = 0x80000000;
        auVar30._0_8_ = 0x8000000080000000;
        auVar30._12_4_ = 0x80000000;
        auVar30._16_4_ = 0x80000000;
        auVar30._20_4_ = 0x80000000;
        auVar30._24_4_ = 0x80000000;
        auVar30._28_4_ = 0x80000000;
        auVar30._32_4_ = 0x80000000;
        auVar30._36_4_ = 0x80000000;
        auVar30._40_4_ = 0x80000000;
        auVar30._44_4_ = 0x80000000;
        auVar30._48_4_ = 0x80000000;
        auVar30._52_4_ = 0x80000000;
        auVar30._56_4_ = 0x80000000;
        auVar30._60_4_ = 0x80000000;
        auVar53 = vxorps_avx512dq(auVar74,auVar30);
        uVar38 = uVar37;
        do {
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 8);
          auVar83._4_4_ = uVar3;
          auVar83._0_4_ = uVar3;
          auVar83._8_4_ = uVar3;
          auVar83._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
          auVar83._20_4_ = uVar3;
          auVar83._16_4_ = uVar3;
          auVar83._24_4_ = uVar3;
          auVar83._28_4_ = uVar3;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
          auVar69 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,
                                                  uVar4))),CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3))))),auVar83,1);
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 8);
          auVar86._4_4_ = uVar3;
          auVar86._0_4_ = uVar3;
          auVar86._8_4_ = uVar3;
          auVar86._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 0xc);
          auVar86._20_4_ = uVar3;
          auVar86._16_4_ = uVar3;
          auVar86._24_4_ = uVar3;
          auVar86._28_4_ = uVar3;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 4);
          auVar47 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,
                                                  uVar4))),CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3))))),auVar86,1);
          auVar48 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar53,auVar61);
          auVar69 = vfmadd213ps_avx512f(auVar48,auVar69,auVar47);
          *(undefined1 (*) [64])ptr = auVar69;
          ptr = (float *)((long)ptr + 0x40);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 0x10);
          uVar37 = uVar38 + 0x10;
          iVar40 = uVar38 + 0x1f;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
      if ((int)(uVar37 + 7) < (int)uVar34) {
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        auVar27._16_4_ = 0x80000000;
        auVar27._20_4_ = 0x80000000;
        auVar27._24_4_ = 0x80000000;
        auVar27._28_4_ = 0x80000000;
        auVar44 = vxorps_avx512vl(auVar45,auVar27);
        uVar38 = uVar37;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          auVar84._4_4_ = uVar3;
          auVar84._0_4_ = uVar3;
          auVar84._8_4_ = uVar3;
          auVar84._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
          auVar84._20_4_ = uVar3;
          auVar84._16_4_ = uVar3;
          auVar84._24_4_ = uVar3;
          auVar84._28_4_ = uVar3;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          auVar87._4_4_ = uVar3;
          auVar87._0_4_ = uVar3;
          auVar87._8_4_ = uVar3;
          auVar87._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 4);
          auVar87._20_4_ = uVar3;
          auVar87._16_4_ = uVar3;
          auVar87._24_4_ = uVar3;
          auVar87._28_4_ = uVar3;
          auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar44,auVar76)
          ;
          auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar84,auVar87);
          *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar42);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 8);
          uVar37 = uVar38 + 8;
          iVar40 = uVar38 + 0xf;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
      if ((int)(uVar37 + 3) < (int)uVar34) {
        auVar21._8_4_ = 0x80000000;
        auVar21._0_8_ = 0x8000000080000000;
        auVar21._12_4_ = 0x80000000;
        auVar42 = vxorps_avx512vl(auVar57,auVar21);
        uVar38 = uVar37;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          auVar81._4_4_ = uVar3;
          auVar81._0_4_ = uVar3;
          auVar81._8_4_ = uVar3;
          auVar81._12_4_ = uVar3;
          auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar42,auVar54)
          ;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          auVar22._4_4_ = uVar3;
          auVar22._0_4_ = uVar3;
          auVar22._8_4_ = uVar3;
          auVar22._12_4_ = uVar3;
          auVar43 = vfmadd213ps_avx512vl(auVar43,auVar81,auVar22);
          *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar43;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 4);
          uVar37 = uVar38 + 4;
          iVar40 = uVar38 + 7;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
    }
    if (elempack == 1) {
      if ((int)(uVar37 + 0xf) < (int)uVar34) {
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar31._32_4_ = 0x80000000;
        auVar31._36_4_ = 0x80000000;
        auVar31._40_4_ = 0x80000000;
        auVar31._44_4_ = 0x80000000;
        auVar31._48_4_ = 0x80000000;
        auVar31._52_4_ = 0x80000000;
        auVar31._56_4_ = 0x80000000;
        auVar31._60_4_ = 0x80000000;
        auVar53 = vxorps_avx512dq(auVar74,auVar31);
        uVar38 = uVar37;
        do {
          auVar74 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar53,auVar61);
          auVar74 = vfmadd213ps_avx512f(auVar74,*(undefined1 (*) [64])gamma_ptr,
                                        *(undefined1 (*) [64])beta_ptr);
          *(undefined1 (*) [64])ptr = auVar74;
          ptr = (float *)((long)ptr + 0x40);
          gamma_ptr = (float *)((long)gamma_ptr + 0x40);
          beta_ptr = (float *)((long)beta_ptr + 0x40);
          uVar37 = uVar38 + 0x10;
          iVar40 = uVar38 + 0x1f;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
      if ((int)(uVar37 + 7) < (int)uVar34) {
        auVar28._8_4_ = 0x80000000;
        auVar28._0_8_ = 0x8000000080000000;
        auVar28._12_4_ = 0x80000000;
        auVar28._16_4_ = 0x80000000;
        auVar28._20_4_ = 0x80000000;
        auVar28._24_4_ = 0x80000000;
        auVar28._28_4_ = 0x80000000;
        auVar44 = vxorps_avx512vl(auVar45,auVar28);
        uVar38 = uVar37;
        do {
          auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar44,auVar76)
          ;
          auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),
                                    *(undefined1 (*) [32])*(undefined1 (*) [64])gamma_ptr,
                                    *(undefined1 (*) [32])*(undefined1 (*) [64])beta_ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar42);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x20);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 0x20);
          uVar37 = uVar38 + 8;
          iVar40 = uVar38 + 0xf;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
      if ((int)(uVar37 + 3) < (int)uVar34) {
        auVar23._8_4_ = 0x80000000;
        auVar23._0_8_ = 0x8000000080000000;
        auVar23._12_4_ = 0x80000000;
        auVar42 = vxorps_avx512vl(auVar57,auVar23);
        uVar38 = uVar37;
        do {
          auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar42,auVar54)
          ;
          auVar43 = vfmadd213ps_fma(auVar43,*(undefined1 (*) [16])*(undefined1 (*) [64])gamma_ptr,
                                    *(undefined1 (*) [16])*(undefined1 (*) [64])beta_ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar43;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 0x10);
          uVar37 = uVar38 + 4;
          iVar40 = uVar38 + 7;
          uVar38 = uVar37;
        } while (iVar40 < (int)uVar34);
      }
    }
    if (uVar34 - uVar37 != 0 && (int)uVar37 <= (int)uVar34) {
      lVar35 = 0;
      do {
        auVar42 = vfnmadd132ss_fma(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar35 * 4)),
                                   auVar56,auVar55);
        auVar42 = vfnmadd213ss_fma(ZEXT416(*(uint *)(*(undefined1 (*) [64])gamma_ptr + lVar35 * 4)),
                                   auVar42,ZEXT416(*(uint *)(*(undefined1 (*) [64])beta_ptr +
                                                            lVar35 * 4)));
        *(int *)(*(undefined1 (*) [64])ptr + lVar35 * 4) = auVar42._0_4_;
        lVar35 = lVar35 + 1;
      } while (uVar34 - uVar37 != (int)lVar35);
    }
  }
  return;
}

Assistant:

static void layernorm(float* ptr, const float* gamma_ptr, const float* beta_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _mean_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _mean_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _mean = _mm_set1_ps(0.f);
#endif // __SSE2__
    float mean = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _mean_avx512 = _mm512_add_ps(_mean_avx512, _p);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _mean_avx = _mm256_add_ps(_mean_avx, _p);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _mean = _mm_add_ps(_mean, _p);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            mean += ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        _mean_avx512 = _mm512_div_ps(_mean_avx512, _elemcount);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        _mean_avx = _mm256_div_ps(_mean_avx, _elemcount);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__
        {
            __m128 _mean0 = _mm256_castps256_ps128(_mean_avx);
            __m128 _mean1 = _mm256_extractf128_ps(_mean_avx, 1);
            _mean = _mm_add_ps(_mean, _mean0);
            _mean = _mm_add_ps(_mean, _mean1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        _mean = _mm_div_ps(_mean, _elemcount);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        mean += _mm512_comp_reduce_add_ps(_mean_avx512);
#endif // __AVX512F__
        mean += _mm256_reduce_add_ps(_mean_avx);
#endif // __AVX__
        mean += _mm_reduce_add_ps(_mean);
#endif // __SSE2__

        mean = mean / elemcount;
#if __SSE2__
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _var_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _var_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _var = _mm_set1_ps(0.f);
#endif // __SSE2__
    float var = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _p = _mm512_sub_ps(_p, _mean_avx512);
            _var_avx512 = _mm512_fmadd_ps(_p, _p, _var_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _p = _mm256_sub_ps(_p, _mean_avx);
            _var_avx = _mm256_comp_fmadd_ps(_p, _p, _var_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _p = _mm_sub_ps(_p, _mean);
            _var = _mm_comp_fmadd_ps(_p, _p, _var);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = ptr0[0] - mean;
            var += v * v;
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);
        _var_avx512 = _mm512_div_ps(_var_avx512, _elemcount);
        _var_avx512 = _mm512_add_ps(_var_avx512, _eps);
        __m256 _var0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 0));
        __m256 _var1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 1));
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var0), _var1, 1);
        _mean_avx512 = _mm512_mul_ps(_mean_avx512, _var_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);
        _var_avx = _mm256_div_ps(_var_avx, _elemcount);
        _var_avx = _mm256_add_ps(_var_avx, _eps);
        _var_avx = _mm256_rsqrt_ps(_var_avx);
        _mean_avx = _mm256_mul_ps(_mean_avx, _var_avx);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__
        {
            __m128 _var0 = _mm256_castps256_ps128(_var_avx);
            __m128 _var1 = _mm256_extractf128_ps(_var_avx, 1);
            _var = _mm_add_ps(_var, _var0);
            _var = _mm_add_ps(_var, _var1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);
        _var = _mm_div_ps(_var, _elemcount);
        _var = _mm_add_ps(_var, _eps);
        _var = _mm_rsqrt_ps(_var);
        _mean = _mm_mul_ps(_mean, _var);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        var += _mm512_comp_reduce_add_ps(_var_avx512);
#endif // __AVX512F__
        var += _mm256_reduce_add_ps(_var_avx);
#endif // __AVX__
        var += _mm_reduce_add_ps(_var);
#endif // __SSE2__

        var = 1.f / sqrtf(var / elemcount + eps);
        mean = mean * var;
#if __SSE2__
        _var = _mm_set1_ps(var);
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr && beta_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                __m512 _beta = _mm512_set1_ps(beta_ptr[0]);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                __m256 _beta0 = _mm256_set1_ps(beta_ptr[0]);
                __m256 _beta1 = _mm256_set1_ps(beta_ptr[1]);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta0), _beta1, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _beta = _mm256_set1_ps(beta_ptr[0]);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m128 _beta2 = _mm_set1_ps(beta_ptr[2]);
                __m128 _beta3 = _mm_set1_ps(beta_ptr[3]);
                __m256 _beta01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                __m256 _beta23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta2), _beta3, 1);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta01), _beta23, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m256 _beta = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                __m128 _beta = _mm_set1_ps(beta_ptr[0]);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                __m512 _beta = _mm512_loadu_ps(beta_ptr);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
                beta_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                __m256 _beta = _mm256_loadu_ps(beta_ptr);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
                beta_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                __m128 _beta = _mm_loadu_ps(beta_ptr);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * var - mean) * gamma_ptr[0] + beta_ptr[0];
            ptr++;
            gamma_ptr++;
            beta_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_comp_fmsub_ps(_p, _var, _mean);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * var - mean;
            ptr++;
        }
    }
}